

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O0

bool cmIfCommand(vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
                cmExecutionStatus *inStatus)

{
  byte bVar1;
  cmMakefile *this;
  ulong uVar2;
  pointer pcVar3;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_170;
  unique_ptr<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_> local_168;
  __single_object fb;
  string local_158;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  undefined1 local_d8 [8];
  string err;
  undefined1 local_b0 [7];
  bool isTrue;
  undefined1 local_a0 [8];
  cmConditionEvaluator conditionEvaluator;
  MessageType status;
  undefined1 local_60 [8];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  string errorString;
  cmMakefile *makefile;
  cmExecutionStatus *inStatus_local;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  
  this = cmExecutionStatus::GetMakefile(inStatus);
  std::__cxx11::string::string
            ((string *)
             &expandedArguments.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
            ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60);
  cmMakefile::ExpandArguments
            (this,args,
             (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60);
  cmMakefile::GetBacktrace((cmMakefile *)local_b0);
  cmConditionEvaluator::cmConditionEvaluator
            ((cmConditionEvaluator *)local_a0,this,(cmListFileBacktrace *)local_b0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_b0);
  err.field_2._M_local_buf[0xf] =
       cmConditionEvaluator::IsTrue
                 ((cmConditionEvaluator *)local_a0,
                  (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                  local_60,(string *)
                           &expandedArguments.
                            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  &conditionEvaluator.Policy139Status);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_108,"if ");
    cmIfCommandError_abi_cxx11_
              (&local_158,
               (vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               local_60);
    cmAlphaNum::cmAlphaNum(&local_138,&local_158);
    cmStrCat<std::__cxx11::string>
              ((string *)local_d8,&local_108,&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &expandedArguments.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_158);
    if (conditionEvaluator.Policy139Status != NEW) {
      cmMakefile::IssueMessage(this,conditionEvaluator.Policy139Status,(string *)local_d8);
    }
    else {
      cmMakefile::IssueMessage(this,FATAL_ERROR,(string *)local_d8);
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = 1;
    }
    fb._M_t.super___uniq_ptr_impl<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_>.
    _M_t.super__Tuple_impl<0UL,_cmIfFunctionBlocker_*,_std::default_delete<cmIfFunctionBlocker>_>.
    super__Head_base<0UL,_cmIfFunctionBlocker_*,_false>._M_head_impl._5_3_ = 0;
    fb._M_t.super___uniq_ptr_impl<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_>.
    _M_t.super__Tuple_impl<0UL,_cmIfFunctionBlocker_*,_std::default_delete<cmIfFunctionBlocker>_>.
    super__Head_base<0UL,_cmIfFunctionBlocker_*,_false>._M_head_impl._4_1_ =
         conditionEvaluator.Policy139Status == NEW;
    std::__cxx11::string::~string((string *)local_d8);
    if (fb._M_t.
        super___uniq_ptr_impl<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_>._M_t.
        super__Tuple_impl<0UL,_cmIfFunctionBlocker_*,_std::default_delete<cmIfFunctionBlocker>_>.
        super__Head_base<0UL,_cmIfFunctionBlocker_*,_false>._M_head_impl._4_4_ != 0)
    goto LAB_0051d760;
  }
  std::make_unique<cmIfFunctionBlocker>();
  bVar1 = err.field_2._M_local_buf[0xf] ^ 0xff;
  pcVar3 = std::unique_ptr<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_>::
           operator->(&local_168);
  pcVar3->IsBlocking = (bool)(bVar1 & 1);
  if ((err.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar3 = std::unique_ptr<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_>::
             operator->(&local_168);
    pcVar3->HasRun = true;
  }
  pcVar3 = std::unique_ptr<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_>::
           operator->(&local_168);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::operator=
            (&pcVar3->Args,args);
  std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>::
  unique_ptr<cmIfFunctionBlocker,std::default_delete<cmIfFunctionBlocker>,void>
            ((unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>> *)&local_170,
             &local_168);
  cmMakefile::AddFunctionBlocker(this,&local_170);
  std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
            (&local_170);
  std::unique_ptr<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_>::~unique_ptr
            (&local_168);
  args_local._7_1_ = 1;
  fb._M_t.super___uniq_ptr_impl<cmIfFunctionBlocker,_std::default_delete<cmIfFunctionBlocker>_>._M_t
  .super__Tuple_impl<0UL,_cmIfFunctionBlocker_*,_std::default_delete<cmIfFunctionBlocker>_>.
  super__Head_base<0UL,_cmIfFunctionBlocker_*,_false>._M_head_impl._4_4_ = 1;
LAB_0051d760:
  cmConditionEvaluator::~cmConditionEvaluator((cmConditionEvaluator *)local_a0);
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
            ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
             local_60);
  std::__cxx11::string::~string
            ((string *)
             &expandedArguments.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmIfCommand(std::vector<cmListFileArgument> const& args,
                 cmExecutionStatus& inStatus)
{
  cmMakefile& makefile = inStatus.GetMakefile();
  std::string errorString;

  std::vector<cmExpandedCommandArgument> expandedArguments;
  makefile.ExpandArguments(args, expandedArguments);

  MessageType status;

  cmConditionEvaluator conditionEvaluator(makefile, makefile.GetBacktrace());

  bool isTrue =
    conditionEvaluator.IsTrue(expandedArguments, errorString, status);

  if (!errorString.empty()) {
    std::string err =
      cmStrCat("if ", cmIfCommandError(expandedArguments), errorString);
    if (status == MessageType::FATAL_ERROR) {
      makefile.IssueMessage(MessageType::FATAL_ERROR, err);
      cmSystemTools::SetFatalErrorOccurred();
      return true;
    }
    makefile.IssueMessage(status, err);
  }

  {
    auto fb = cm::make_unique<cmIfFunctionBlocker>();
    // if is isn't true block the commands
    fb->IsBlocking = !isTrue;
    if (isTrue) {
      fb->HasRun = true;
    }
    fb->Args = args;
    makefile.AddFunctionBlocker(std::move(fb));
  }

  return true;
}